

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.h
# Opt level: O0

Var __thiscall
Js::TypedArray<unsigned_short,_false,_false>::BaseTypedDirectGetItem
          (TypedArray<unsigned_short,_false,_false> *this,uint32 index)

{
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  uint uVar4;
  ArrayBufferBase *pAVar5;
  undefined4 *puVar6;
  ScriptContext *pSVar7;
  JavascriptLibrary *this_00;
  unsigned_short *typedBuffer;
  uint32 index_local;
  TypedArray<unsigned_short,_false,_false> *this_local;
  TypedArray<unsigned_short,_false,_false> *local_10;
  
  bVar2 = Js::TypedArrayBase::IsDetachedBuffer(&this->super_TypedArrayBase);
  if (bVar2) {
    pSVar7 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
    JavascriptError::ThrowTypeError(pSVar7,-0x7ff5ebe5,(PCWSTR)0x0);
  }
  uVar3 = ArrayObject::GetLength((ArrayObject *)this);
  if (index < uVar3) {
    uVar3 = Js::TypedArrayBase::GetByteOffset(&this->super_TypedArrayBase);
    pAVar5 = ArrayBufferParent::GetArrayBuffer((ArrayBufferParent *)this);
    uVar4 = (*(pAVar5->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x71])();
    if ((ulong)uVar4 < (ulong)(index + 1) * 2 + (ulong)uVar3) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/TypedArray.h"
                                  ,0x129,
                                  "((index + 1)* sizeof(TypeName)+GetByteOffset() <= GetArrayBuffer()->GetByteLength())"
                                  ,
                                  "(index + 1)* sizeof(TypeName)+GetByteOffset() <= GetArrayBuffer()->GetByteLength()"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    uVar4 = (uint)*(ushort *)((this->super_TypedArrayBase).buffer + (ulong)index * 2);
    pSVar7 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
    bVar2 = TaggedInt::IsOverflow(uVar4);
    if (bVar2) {
      local_10 = (TypedArray<unsigned_short,_false,_false> *)
                 JavascriptNumber::NewInlined((double)uVar4,pSVar7);
    }
    else {
      local_10 = (TypedArray<unsigned_short,_false,_false> *)TaggedInt::ToVarUnchecked(uVar4);
    }
    this_local = local_10;
  }
  else {
    this_00 = RecyclableObject::GetLibrary((RecyclableObject *)this);
    this_local = (TypedArray<unsigned_short,_false,_false> *)
                 JavascriptLibraryBase::GetUndefined(&this_00->super_JavascriptLibraryBase);
  }
  return this_local;
}

Assistant:

inline Var BaseTypedDirectGetItem(__in uint32 index)
        {
            if (this->IsDetachedBuffer()) // 9.4.5.8 IntegerIndexedElementGet
            {
                JavascriptError::ThrowTypeError(GetScriptContext(), JSERR_DetachedTypedArray);
            }

            if (index < GetLength())
            {
                Assert((index + 1)* sizeof(TypeName)+GetByteOffset() <= GetArrayBuffer()->GetByteLength());
                TypeName* typedBuffer = (TypeName*)buffer;
                return JavascriptNumber::ToVar(typedBuffer[index], GetScriptContext());
            }
            return GetLibrary()->GetUndefined();
        }